

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncRgbLedAnalyzerResults.cpp
# Opt level: O1

void __thiscall
AsyncRgbLedAnalyzerResults::GenerateBubbleText
          (AsyncRgbLedAnalyzerResults *this,U64 frame_index,Channel *channel,
          DisplayBase display_base)

{
  U8 bitSize;
  U8 webColor [3];
  RGBValue rgb;
  char webBuf [8];
  char greenString [16];
  char redString [16];
  Frame frame;
  char blueString [16];
  char buf [256];
  byte local_19b;
  byte local_19a;
  byte local_199;
  RGBValue local_198;
  char local_190 [8];
  char local_188 [16];
  char local_178 [24];
  Frame local_160 [16];
  U64 local_150;
  char local_138 [16];
  char local_128 [256];
  
  AnalyzerResults::ClearResultStrings();
  AnalyzerResults::GetFrame((ulonglong)local_160);
  local_198 = RGBValue::CreateFromU64(local_150);
  bitSize = AsyncRgbLedAnalyzerSettings::BitSize(this->mSettings);
  RGBValue::ConvertTo8Bit(&local_198,bitSize,&local_19b);
  snprintf(local_190,8,"#%02x%02x%02x",(ulong)local_19b,(ulong)local_19a,(ulong)local_199);
  GenerateRGBStrings(this,&local_198,display_base,0x10,local_178,local_188,local_138);
  snprintf(local_128,0x100,"LED %d Red: %s Green: %s Blue: %s %s");
  AnalyzerResults::AddResultString
            ((char *)this,local_128,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  snprintf(local_128,0x100,"%d R: %s G: %s B: %s %s");
  AnalyzerResults::AddResultString
            ((char *)this,local_128,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  snprintf(local_128,0x100,"(%d) %s");
  AnalyzerResults::AddResultString
            ((char *)this,local_128,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  AnalyzerResults::AddResultString
            ((char *)this,local_190,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  Frame::~Frame(local_160);
  return;
}

Assistant:

void AsyncRgbLedAnalyzerResults::GenerateBubbleText( U64 frame_index, Channel& channel, DisplayBase display_base )
{
    ClearResultStrings();
    Frame frame = GetFrame( frame_index );

    U32 ledIndex = frame.mData2;
    RGBValue rgb = RGBValue::CreateFromU64( frame.mData1 );

    // generate a Web/CSS representation of the color value
    U8 webColor[ 3 ];
    rgb.ConvertTo8Bit( mSettings->BitSize(), webColor );
    char webBuf[ 8 ];
    ::snprintf( webBuf, sizeof( webBuf ), "#%02x%02x%02x", webColor[ 0 ], webColor[ 1 ], webColor[ 2 ] );

    const int colorNumericBufferLength = 16;
    char redString[ colorNumericBufferLength ], greenString[ colorNumericBufferLength ], blueString[ colorNumericBufferLength ];

    GenerateRGBStrings( rgb, display_base, colorNumericBufferLength, redString, greenString, blueString );

    // generate four different string variants of varying length, starting with
    // the longest and decreasing in size
    char buf[ 256 ];

    // example: LED: 13 Red: 0x1A Green: 0x2B Blue: 0x3C #1A2B3C
    ::snprintf( buf, sizeof( buf ), "LED %d Red: %s Green: %s Blue: %s %s", ledIndex, redString, greenString, blueString, webBuf );
    AddResultString( buf );

    // example: 13 R:0x1A G:0x2B B:0x3C #1A2B3C
    ::snprintf( buf, sizeof( buf ), "%d R: %s G: %s B: %s %s", ledIndex, redString, greenString, blueString, webBuf );
    AddResultString( buf );

    // example: (13) #1A2B3C
    ::snprintf( buf, sizeof( buf ), "(%d) %s", ledIndex, webBuf );
    AddResultString( buf );

    // example: #1A2B3C
    AddResultString( webBuf );
}